

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::convert_row_major_matrix
          (string *__return_storage_ptr__,CompilerGLSL *this,string *exp_str,SPIRType *exp_type,
          uint32_t param_3,bool param_4)

{
  uint32_t uVar1;
  uint32_t uVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  CompilerError *this_00;
  undefined4 in_register_00000084;
  char (*ts_2) [2];
  undefined2 in_stack_ffffffffffffff88;
  uint uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> column_expr;
  string local_50;
  
  ts_2 = (char (*) [2])CONCAT44(in_register_00000084,param_3);
  strip_enclosed_expression((CompilerGLSL *)__return_storage_ptr__,exp_str);
  bVar3 = Compiler::is_matrix(&this->super_Compiler,exp_type);
  if (!bVar3) {
    lVar5 = ::std::__cxx11::string::rfind((char)exp_str,0x5b);
    if (lVar5 != -1) {
      ::std::__cxx11::string::substr((ulong)&column_expr,(ulong)exp_str);
      ::std::__cxx11::string::resize((ulong)exp_str);
      type_to_glsl_constructor_abi_cxx11_(&local_50,this,exp_type);
      ::std::operator+(__return_storage_ptr__,&local_50,"(");
      ::std::__cxx11::string::~string((string *)&local_50);
      uVar4 = 0;
      while (uVar4 < exp_type->vecsize) {
        join<std::__cxx11::string&,char,unsigned_int&,char,std::__cxx11::string&>
                  (&local_50,(spirv_cross *)exp_str,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xffffffffffffff8b,&stack0xffffffffffffff8c,
                   (uint *)&stack0xffffffffffffff8a,(char *)&column_expr,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(uVar4,CONCAT13(0x5b,CONCAT12(0x5d,in_stack_ffffffffffffff88))));
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        uVar6 = uVar4;
        ::std::__cxx11::string::~string((string *)&local_50);
        uVar4 = uVar6 + 1;
        if (uVar4 < exp_type->vecsize) {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          uVar4 = uVar6 + 1;
        }
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&column_expr);
      return __return_storage_ptr__;
    }
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)exp_str);
    return __return_storage_ptr__;
  }
  if (0x77 < (this->options).version) {
    join<char_const(&)[11],std::__cxx11::string&,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)0x389db2,(char (*) [11])exp_str,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37f234,ts_2);
    return __return_storage_ptr__;
  }
  uVar1 = exp_type->vecsize;
  uVar2 = exp_type->columns;
  if (uVar2 == 2 && uVar1 == 2) {
    if (this->requires_transpose_2x2 != false) goto LAB_0026f9ce;
    this->requires_transpose_2x2 = true;
  }
  else if (uVar2 == 3 && uVar1 == 3) {
    if (this->requires_transpose_3x3 != false) goto LAB_0026f9ce;
    this->requires_transpose_3x3 = true;
  }
  else {
    if ((uVar1 != 4) || (uVar2 != 4)) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&column_expr,
                 "Non-square matrices are not supported in legacy GLSL, cannot transpose.",
                 (allocator *)&local_50);
      CompilerError::CompilerError(this_00,&column_expr);
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (this->requires_transpose_4x4 != false) goto LAB_0026f9ce;
    this->requires_transpose_4x4 = true;
  }
  Compiler::force_recompile(&this->super_Compiler);
LAB_0026f9ce:
  join<char_const(&)[14],std::__cxx11::string&,char_const(&)[2]>
            (__return_storage_ptr__,(spirv_cross *)"spvTranspose(",(char (*) [14])exp_str,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37f234,ts_2);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::convert_row_major_matrix(string exp_str, const SPIRType &exp_type, uint32_t /* physical_type_id */,
                                              bool /*is_packed*/)
{
	strip_enclosed_expression(exp_str);
	if (!is_matrix(exp_type))
	{
		auto column_index = exp_str.find_last_of('[');
		if (column_index == string::npos)
			return exp_str;

		auto column_expr = exp_str.substr(column_index);
		exp_str.resize(column_index);

		auto transposed_expr = type_to_glsl_constructor(exp_type) + "(";

		// Loading a column from a row-major matrix. Unroll the load.
		for (uint32_t c = 0; c < exp_type.vecsize; c++)
		{
			transposed_expr += join(exp_str, '[', c, ']', column_expr);
			if (c + 1 < exp_type.vecsize)
				transposed_expr += ", ";
		}

		transposed_expr += ")";
		return transposed_expr;
	}
	else if (options.version < 120)
	{
		// GLSL 110, ES 100 do not have transpose(), so emulate it.  Note that
		// these GLSL versions do not support non-square matrices.
		if (exp_type.vecsize == 2 && exp_type.columns == 2)
		{
			if (!requires_transpose_2x2)
			{
				requires_transpose_2x2 = true;
				force_recompile();
			}
		}
		else if (exp_type.vecsize == 3 && exp_type.columns == 3)
		{
			if (!requires_transpose_3x3)
			{
				requires_transpose_3x3 = true;
				force_recompile();
			}
		}
		else if (exp_type.vecsize == 4 && exp_type.columns == 4)
		{
			if (!requires_transpose_4x4)
			{
				requires_transpose_4x4 = true;
				force_recompile();
			}
		}
		else
			SPIRV_CROSS_THROW("Non-square matrices are not supported in legacy GLSL, cannot transpose.");
		return join("spvTranspose(", exp_str, ")");
	}
	else
		return join("transpose(", exp_str, ")");
}